

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O3

void __thiscall
__gnu_cxx::new_allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>>::
destroy<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>>
          (new_allocator<de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>> *this,
          SharedPtr<deqp::egl::GLES2ThreadTest::Program> *__p)

{
  deInt32 *pdVar1;
  
  if (__p->m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &__p->m_state->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      __p->m_ptr = (Program *)0x0;
      (*__p->m_state->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &__p->m_state->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (__p->m_state != (SharedPtrStateBase *)0x0) {
        (*__p->m_state->_vptr_SharedPtrStateBase[1])();
      }
      __p->m_state = (SharedPtrStateBase *)0x0;
    }
  }
  return;
}

Assistant:

inline void SharedPtr<T>::release (void)
{
	if (m_state)
	{
		if (deAtomicDecrement32(&m_state->strongRefCount) == 0)
		{
			m_ptr = DE_NULL;
			m_state->deletePtr();
		}

		if (deAtomicDecrement32(&m_state->weakRefCount) == 0)
		{
			delete m_state;
			m_state = DE_NULL;
		}
	}
}